

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutation_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Permutation_iterator::elementary_increment_optim_3
          (Permutation_iterator *this)

{
  reference pvVar1;
  uint local_2c;
  uint x;
  uint k;
  uint j;
  Permutation_iterator *this_local;
  
  if (this->ct_ == 0) {
    this->ct_ = 5;
    x = 2;
    while( true ) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->d_,(ulong)x);
      if (*pvVar1 != x + 1) break;
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->d_,(ulong)x);
      *pvVar1 = 0;
      x = x + 1;
    }
    if (x == this->n_ - 1) {
      this->is_end_ = true;
    }
    else {
      if ((x + 1 & 1) == 0) {
        local_2c = 0;
      }
      else {
        pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->d_,(ulong)x);
        local_2c = *pvVar1;
      }
      swap_two_indices(this,(ulong)(x + 1),(ulong)local_2c);
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->d_,(ulong)x);
      *pvVar1 = *pvVar1 + 1;
    }
  }
  else {
    this->ct_ = this->ct_ - 1;
    swap_two_indices(this,(ulong)((this->ct_ & 1) + 1),0);
  }
  return;
}

Assistant:

void elementary_increment_optim_3() {
    if (ct_ != 0) {
      --ct_;
      swap_two_indices(1 + (ct_ % 2), 0);
    } else {
      ct_ = 5;
      uint j = 2;
      while (d_[j] == j + 1) {
        d_[j] = 0;
        ++j;
      }
      if (j == n_ - 1) {
        is_end_ = true;
        return;
      }
      uint k = j + 1;
      uint x = (k % 2 ? d_[j] : 0);
      swap_two_indices(k, x);
      ++d_[j];
    }
  }